

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O0

TestPartResult * __thiscall
testing::TestPartResultArray::GetTestPartResult(TestPartResultArray *this,int index)

{
  int iVar1;
  const_reference pvVar2;
  int index_local;
  TestPartResultArray *this_local;
  
  if (-1 < index) {
    iVar1 = size(this);
    if (index < iVar1) goto LAB_0012cf0b;
  }
  printf("\nInvalid index (%d) into TestPartResultArray.\n",(ulong)(uint)index);
  internal::posix::Abort();
LAB_0012cf0b:
  pvVar2 = std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::
           operator[]((vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_> *)
                      this,(long)index);
  return pvVar2;
}

Assistant:

const TestPartResult& TestPartResultArray::GetTestPartResult(int index) const {
  if (index < 0 || index >= size()) {
    printf("\nInvalid index (%d) into TestPartResultArray.\n", index);
    internal::posix::Abort();
  }

  return array_[index];
}